

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

msecnode_t * P_DelSecnode(msecnode_t *node,offset_in_sector_t_to_unknown listhead)

{
  msecnode_t *pmVar1;
  msecnode_t *pmVar2;
  msecnode_t *pmVar3;
  msecnode_t **ppmVar4;
  
  if (node != (msecnode_t *)0x0) {
    pmVar1 = node->m_tprev;
    pmVar2 = node->m_tnext;
    if (pmVar1 != (msecnode_t *)0x0) {
      pmVar1->m_tnext = pmVar2;
    }
    if (pmVar2 != (msecnode_t *)0x0) {
      pmVar2->m_tprev = pmVar1;
    }
    pmVar1 = node->m_sprev;
    pmVar3 = node->m_snext;
    if (pmVar1 == (msecnode_t *)0x0) {
      ppmVar4 = (msecnode_t **)((long)&node->m_sector->planes[0].xform.xOffs + listhead);
    }
    else {
      ppmVar4 = &pmVar1->m_snext;
    }
    *ppmVar4 = pmVar3;
    if (pmVar3 != (msecnode_t *)0x0) {
      pmVar3->m_sprev = pmVar1;
    }
    node->m_snext = headsecnode;
    headsecnode = node;
    return pmVar2;
  }
  return (msecnode_t *)0x0;
}

Assistant:

msecnode_t *P_DelSecnode(msecnode_t *node, msecnode_t *sector_t::*listhead)
{
	msecnode_t* tp;  // prev node on thing thread
	msecnode_t* tn;  // next node on thing thread
	msecnode_t* sp;  // prev node on sector thread
	msecnode_t* sn;  // next node on sector thread

	if (node)
	{
		// Unlink from the Thing thread. The Thing thread begins at
		// sector_list and not from AActor->touching_sectorlist.

		tp = node->m_tprev;
		tn = node->m_tnext;
		if (tp)
			tp->m_tnext = tn;
		if (tn)
			tn->m_tprev = tp;

		// Unlink from the sector thread. This thread begins at
		// sector_t->touching_thinglist.

		sp = node->m_sprev;
		sn = node->m_snext;
		if (sp)
			sp->m_snext = sn;
		else
			node->m_sector->*listhead = sn;
		if (sn)
			sn->m_sprev = sp;

		// Return this node to the freelist

		P_PutSecnode(node);
		return tn;
	}
	return NULL;
}